

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_2.cpp
# Opt level: O3

void __thiscall QOpenGLFunctions_1_2::~QOpenGLFunctions_1_2(QOpenGLFunctions_1_2 *this)

{
  QAtomicInt *pQVar1;
  
  (this->super_QAbstractOpenGLFunctions)._vptr_QAbstractOpenGLFunctions =
       (_func_int **)&PTR__QOpenGLFunctions_1_2_001a1b00;
  if (this->d_1_0_Core != (QOpenGLFunctions_1_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Core != (QOpenGLFunctions_1_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Core != (QOpenGLFunctions_1_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_0_Deprecated != (QOpenGLFunctions_1_0_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Deprecated != (QOpenGLFunctions_1_1_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Deprecated != (QOpenGLFunctions_1_2_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
    return;
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  return;
}

Assistant:

QOpenGLFunctions_1_2::~QOpenGLFunctions_1_2()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
}